

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

void duckdb::StringValueResult::AddPossiblyEscapedValue
               (StringValueResult *result,idx_t buffer_pos,char *value_ptr,idx_t length,bool empty)

{
  idx_t *col_idx;
  idx_t *chunk_idx;
  char escape;
  char quote;
  CSVStateMachine *pCVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  ulong uVar4;
  reference pvVar5;
  ostream *poVar6;
  LogicalTypeId type;
  __string_type error_string;
  string local_1e8;
  string local_1c8;
  ostringstream error;
  undefined1 auStack_1a7 [15];
  
  if ((result->super_ScannerResult).escaped == true) {
    if (result->projecting_columns == false) {
      uVar4 = result->cur_col_id;
    }
    else {
      uVar4 = result->cur_col_id;
      if ((result->projected_columns).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
          super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
          super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
          super__Head_base<0UL,_bool_*,_false>._M_head_impl[uVar4] == false) {
        result->cur_col_id = uVar4 + 1;
        goto LAB_018a5a31;
      }
    }
    if ((result->number_of_columns <= uVar4) &&
       ((((result->super_ScannerResult).state_machine)->state_machine_options).strict_mode.value !=
        true)) {
      return;
    }
    bVar3 = HandleTooManyColumnsError(result,value_ptr,length);
    if (bVar3) goto LAB_018a5a31;
    pvVar5 = vector<duckdb::Vector,_true>::get<true>
                       (&(result->parse_chunk).data,result->chunk_col_id);
    LogicalType::LogicalType((LogicalType *)&error,VARCHAR);
    bVar3 = LogicalType::operator!=(&pvVar5->type,(LogicalType *)&error);
    LogicalType::~LogicalType((LogicalType *)&error);
    if (bVar3) {
      col_idx = &result->cur_col_id;
      chunk_idx = &result->chunk_col_id;
      auVar2[0xf] = 0;
      auVar2._0_15_ = auStack_1a7;
      _error = (anon_union_16_2_67f50693_for_value)(auVar2 << 8);
      LineError::Insert(&result->current_errors,(CSVErrorType *)&error,col_idx,chunk_idx,
                        &(result->super_ScannerResult).last_position,0);
      bVar3 = CSVReaderOptions::IgnoreErrors(((result->super_ScannerResult).state_machine)->options)
      ;
      if (!bVar3) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
        poVar6 = ::std::operator<<((ostream *)&error,"Could not convert string \"");
        error_string._M_dataplus._M_p = (pointer)&error_string.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&error_string,value_ptr,value_ptr + length);
        poVar6 = ::std::operator<<(poVar6,(string *)&error_string);
        poVar6 = ::std::operator<<(poVar6,"\" to \'");
        LogicalTypeIdToString_abi_cxx11_
                  (&local_1c8,
                   (duckdb *)
                   (ulong)*(LogicalTypeId *)
                           ((long)((result->parse_types).
                                   super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                   ._M_t.
                                   super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                   .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>.
                                   _M_head_impl + result->chunk_col_id) + 1),type);
        poVar6 = ::std::operator<<(poVar6,(string *)&local_1c8);
        ::std::operator<<(poVar6,"\'");
        ::std::__cxx11::string::~string((string *)&local_1c8);
        ::std::__cxx11::string::~string((string *)&error_string);
        ::std::__cxx11::stringbuf::str();
        FullLinePosition::SanitizeError(&error_string);
        ::std::__cxx11::string::string((string *)&local_1e8,(string *)&error_string);
        LineError::ModifyErrorMessageOfLastError(&result->current_errors,&local_1e8);
        ::std::__cxx11::string::~string((string *)&local_1e8);
        ::std::__cxx11::string::~string((string *)&error_string);
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
      }
      *col_idx = *col_idx + 1;
      *chunk_idx = *chunk_idx + 1;
      goto LAB_018a5a31;
    }
    pCVar1 = (result->super_ScannerResult).state_machine;
    escape = (pCVar1->dialect_options).state_machine_options.escape.value;
    quote = (pCVar1->dialect_options).state_machine_options.quote.value;
    bVar3 = (pCVar1->dialect_options).state_machine_options.strict_mode.value;
    pvVar5 = vector<duckdb::Vector,_true>::get<true>
                       (&(result->parse_chunk).data,result->chunk_col_id);
    _error = (anon_struct_16_3_d7536bce_for_pointer)
             StringValueScanner::RemoveEscape(value_ptr,length,escape,quote,bVar3,pvVar5);
    value_ptr = auStack_1a7 + 3;
    if (0xc < error._0_4_) {
      value_ptr = error._8_8_;
    }
    length = (idx_t)error._0_4_;
  }
  else if (empty) {
    value_ptr = auStack_1a7 + 3;
    _error = (anon_union_16_2_67f50693_for_value)ZEXT816(0);
    length = 0;
  }
  AddValueToVector(result,value_ptr,length,false);
LAB_018a5a31:
  (result->super_ScannerResult).escaped = false;
  return;
}

Assistant:

void StringValueResult::AddPossiblyEscapedValue(StringValueResult &result, const idx_t buffer_pos,
                                                const char *value_ptr, const idx_t length, const bool empty) {
	if (result.escaped) {
		if (result.projecting_columns) {
			if (!result.projected_columns[result.cur_col_id]) {
				result.cur_col_id++;
				result.escaped = false;
				return;
			}
		}
		if (result.cur_col_id >= result.number_of_columns &&
		    !result.state_machine.state_machine_options.strict_mode.GetValue()) {
			return;
		}
		if (!result.HandleTooManyColumnsError(value_ptr, length)) {
			// If it's an escaped value we have to remove all the escapes, this is not really great
			// If we are going to escape, this vector must be a varchar vector
			if (result.parse_chunk.data[result.chunk_col_id].GetType() != LogicalType::VARCHAR) {
				result.current_errors.Insert(CAST_ERROR, result.cur_col_id, result.chunk_col_id, result.last_position);
				if (!result.state_machine.options.IgnoreErrors()) {
					// We have to write the cast error message.
					std::ostringstream error;
					// Casting Error Message
					error << "Could not convert string \"" << std::string(value_ptr, length) << "\" to \'"
					      << LogicalTypeIdToString(result.parse_types[result.chunk_col_id].type_id) << "\'";
					auto error_string = error.str();
					FullLinePosition::SanitizeError(error_string);
					result.current_errors.ModifyErrorMessageOfLastError(error_string);
				}
				result.cur_col_id++;
				result.chunk_col_id++;
			} else {
				auto value = StringValueScanner::RemoveEscape(
				    value_ptr, length, result.state_machine.dialect_options.state_machine_options.escape.GetValue(),
				    result.state_machine.dialect_options.state_machine_options.quote.GetValue(),
				    result.state_machine.dialect_options.state_machine_options.strict_mode.GetValue(),
				    result.parse_chunk.data[result.chunk_col_id]);
				result.AddValueToVector(value.GetData(), value.GetSize());
			}
		}
	} else {
		if (empty) {
			// empty value
			auto value = string_t();
			result.AddValueToVector(value.GetData(), value.GetSize());
		} else {
			result.AddValueToVector(value_ptr, length);
		}
	}
	result.escaped = false;
}